

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_empty_final_object(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong __n;
  void *__s1;
  void *__s2;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  undefined8 extraout_RAX_00;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong unaff_R12;
  undefined **ppuVar15;
  undefined8 *unaff_R13;
  void *unaff_R14;
  char *unaff_R15;
  bson_t b;
  bson_error_t error;
  code **ppcVar16;
  undefined4 uStack_edc;
  undefined8 uStack_ed8;
  undefined2 uStack_ed0;
  int iStack_ec8;
  int iStack_ec4;
  char acStack_ec0 [504];
  code *pcStack_cc8;
  undefined1 auStack_cb8 [512];
  char *pcStack_ab8;
  code *pcStack_ab0;
  int iStack_aa0;
  int iStack_a9c;
  char acStack_a98 [504];
  long *plStack_8a0;
  ulong uStack_898;
  char *pcStack_890;
  code *pcStack_888;
  long lStack_810;
  long lStack_808;
  undefined1 auStack_800 [128];
  undefined1 auStack_780 [232];
  undefined1 auStack_698 [608];
  long *plStack_438;
  code *pcStack_430;
  undefined1 auStack_428 [8];
  char acStack_420 [16];
  char *pcStack_410;
  code *pcStack_408;
  uint local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_2b8 [648];
  
  pcStack_408 = (code *)0x0;
  pcStack_410 = "}";
  acStack_420[8] = -0x2e;
  acStack_420[9] = '>';
  acStack_420[10] = '\x13';
  acStack_420[0xb] = '\0';
  acStack_420[0xc] = '\0';
  acStack_420[0xd] = '\0';
  acStack_420[0xe] = '\0';
  acStack_420[0xf] = '\0';
  __n = bcon_new(0,"a","{","b","{");
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  pcStack_408 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&local_380,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,local_2b8);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x133f47;
    unaff_R15 = (char *)bson_get_data(&local_380);
    pcStack_408 = (code *)0x133f52;
    unaff_R14 = (void *)bson_get_data(__n);
    if (*(int *)(__n + 4) == local_380._4_4_) {
      pcStack_408 = (code *)0x133f67;
      __s1 = (void *)bson_get_data(__n);
      pcStack_408 = (code *)0x133f77;
      __s2 = (void *)bson_get_data(&local_380);
      pcStack_408 = (code *)0x133f85;
      iVar2 = bcmp(__s1,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x133f96;
        bson_destroy(&local_380);
        pcStack_408 = (code *)0x133f9e;
        bson_destroy(__n);
        return;
      }
    }
    unaff_R13 = &local_380;
    pcStack_408 = (code *)0x133fbf;
    unaff_R12 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_408 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n + 4);
    if (local_380._4_4_ != 0) {
      uVar13 = 0;
      do {
        if (uVar3 == (uint)uVar13) break;
        if (unaff_R15[uVar13] != *(char *)((long)unaff_R14 + uVar13)) goto LAB_0013409c;
        uVar13 = uVar13 + 1;
      } while (local_380._4_4_ != (uint)uVar13);
    }
    uVar4 = local_380._4_4_;
    if (local_380._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar13 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_408 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13,unaff_R12,uVar5);
      pcStack_408 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      unaff_R12 = (ulong)uVar3;
      pcStack_408 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      local_384 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined8 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      unaff_R12 = local_380 >> 0x20;
      pcStack_408 = (code *)0x134075;
      uVar13 = write(uVar3,unaff_R15,unaff_R12);
      if (uVar13 != unaff_R12) goto LAB_001340ad;
      __n = (ulong)*(uint *)(__n + 4);
      pcStack_408 = (code *)0x13408b;
      uVar13 = write(uVar4,unaff_R14,__n);
      if (uVar13 != __n) goto LAB_001340b2;
      uVar13 = (ulong)uVar4;
      pcStack_408 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX;
LAB_0013409c:
      uVar13 = uVar13 & 0xffffffff;
    }
    pcStack_408 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_408 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_408 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_408 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_408 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar7 = acStack_420;
  acStack_420[8] = '\0';
  acStack_420[9] = '\0';
  acStack_420[10] = '\0';
  acStack_420[0xb] = '\0';
  acStack_420[0xc] = '\0';
  acStack_420[0xd] = '\0';
  acStack_420[0xe] = '@';
  acStack_420[0xf] = '0';
  acStack_420[0] = '\v';
  acStack_420[1] = '\0';
  acStack_420[2] = '\0';
  acStack_420[3] = '\0';
  acStack_420[4] = '\0';
  acStack_420[5] = '\0';
  acStack_420[6] = '\0';
  acStack_420[7] = '\0';
  pcStack_430 = (code *)0x1340ea;
  pcStack_410 = (char *)__n;
  pcStack_408 = (code *)unaff_R14;
  plVar6 = (long *)bson_new();
  pcStack_430 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar6,"decimal128",0xffffffff,pcVar7);
  if (cVar1 == '\0') {
    pcStack_430 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_430 = (code *)0x134113;
    pcVar7 = (char *)bson_as_json(plVar6,auStack_428);
    if (pcVar7 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_430 = (code *)0x13413d;
      bson_free(pcVar7);
      pcStack_430 = (code *)0x134145;
      bson_destroy(plVar6);
      return;
    }
    pcStack_430 = (code *)0x134131;
    iVar2 = strcmp(pcVar7,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_430 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar16 = &pcStack_430;
  pcStack_888 = (code *)0x13418d;
  plStack_438 = plVar6;
  pcStack_430 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_698);
  if (cVar1 == '\0') goto LAB_00134231;
  pcStack_888 = (code *)0x1341aa;
  cVar1 = bson_iter_init(auStack_800,auStack_780);
  if (cVar1 == '\0') {
    pcStack_888 = (code *)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    pcStack_888 = (code *)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    pcStack_888 = (code *)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    pcStack_888 = (code *)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_888 = (code *)0x1341c2;
    cVar1 = bson_iter_find(auStack_800,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    pcStack_888 = (code *)0x1341d3;
    iVar2 = bson_iter_type(auStack_800);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar6 = &lStack_810;
    pcStack_888 = (code *)0x1341ed;
    bson_iter_decimal128(auStack_800,plVar6);
    if (lStack_810 != 0xb) goto LAB_00134227;
    if (lStack_808 == 0x3040000000000000) {
      pcStack_888 = (code *)0x134211;
      bson_destroy(auStack_780);
      return;
    }
  }
  pcStack_888 = (code *)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  pcStack_888 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar14 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar15 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_8a0 = plVar6;
  uStack_898 = unaff_R12;
  pcStack_890 = pcVar7;
  pcStack_888 = (code *)unaff_R15;
  do {
    pcStack_ab0 = (code *)0x134273;
    lVar8 = bson_new_from_json(pcVar14,0xffffffffffffffff,&iStack_aa0);
    if (lVar8 != 0) {
      pcStack_ab0 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_ab0 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_a98,
              unaff_R15);
      pcStack_ab0 = (code *)0x1342e3;
      abort();
    }
    if (iStack_aa0 != 1) {
LAB_001342e8:
      pcStack_ab0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_cc8 = (code *)0x13430d;
      pcStack_ab8 = acStack_a98;
      pcStack_ab0 = (code *)&iStack_aa0;
      pcVar7 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_cb8);
      pcStack_cc8 = (code *)0x13431a;
      pcVar14 = (char *)bson_as_json(pcVar7,0);
      if (pcVar14 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_cc8 = (code *)0x134344;
        bson_free(pcVar14);
        pcStack_cc8 = (code *)0x13434c;
        bson_destroy(pcVar7);
        return;
      }
      pcStack_cc8 = (code *)0x134338;
      iVar2 = strcmp(pcVar14,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_cc8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_ed8 = 0x2200223a2261227b;
      uStack_ed0 = 0x7d;
      uStack_edc = 0x227b;
      pcStack_cc8 = (code *)pcVar7;
      lVar8 = bson_new_from_json(&uStack_ed8,9,&iStack_ec8);
      if (lVar8 == 0) {
        if (iStack_ec8 != 1) goto LAB_00134418;
        if (iStack_ec4 != 1) goto LAB_0013441d;
        pcVar7 = acStack_ec0;
        pcVar9 = strstr(pcVar7,"Got parse error");
        if (pcVar9 == (char *)0x0) goto LAB_00134422;
        lVar8 = bson_new_from_json(&uStack_edc,3,&iStack_ec8);
        if (lVar8 != 0) goto LAB_00134413;
        if (iStack_ec8 != 1) goto LAB_0013442a;
        if (iStack_ec4 == 1) {
          pcVar9 = strstr(pcVar7,"Got parse error");
          if (pcVar9 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_00;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar10 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar10,0xf,1,0,uVar5,pcVar7,ppuVar15,unaff_R13,pcVar14,unaff_R15,
                       ppcVar16);
      uVar11 = bcon_new(0,"b",uVar10,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar11,0);
      uVar5 = bson_new();
      uVar11 = bson_new();
      uVar12 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar11,uVar12,0);
      uVar5 = bcon_new(0,"a",uVar10,0xf,1,"b",uVar10,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar10,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar10,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar10,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar10,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_a9c != 2) {
      pcStack_ab0 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    unaff_R15 = ppuVar15[-1];
    pcStack_ab0 = (code *)0x13429a;
    pcVar7 = strstr(acStack_a98,unaff_R15);
    if (pcVar7 == (char *)0x0) goto LAB_001342c0;
    pcVar14 = *ppuVar15;
    ppuVar15 = ppuVar15 + 2;
    if (pcVar14 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
test_bson_json_empty_final_object (void)
{
   const char *json = "{\"a\": {\"b\": {}}}";
   bson_t *bson = BCON_NEW ("a", "{", "b", "{", "}", "}");
   bson_t b = BSON_INITIALIZER;
   bool r;
   bson_error_t error;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r) {
      fprintf (stderr, "%s\n", error.message);
   }

   BSON_ASSERT (r);
   bson_eq_bson (&b, bson);

   bson_destroy (&b);
   bson_destroy (bson);
}